

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O0

string * benchmark::LocalDateTimeString_abi_cxx11_(void)

{
  string *in_RDI;
  bool in_stack_0000012f;
  
  (anonymous_namespace)::DateTimeString_abi_cxx11_(in_stack_0000012f);
  return in_RDI;
}

Assistant:

std::string LocalDateTimeString() {
  return DateTimeString(true);
}